

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

void __thiscall
xmrig::CpuLaunchStatus::start
          (CpuLaunchStatus *this,
          vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *threads,size_t memory
          )

{
  uint64_t uVar1;
  
  this->m_memory = memory;
  this->m_errors = 0;
  this->m_hugePages = 0;
  this->m_pages = 0;
  this->m_started = 0;
  this->m_threads =
       ((long)(threads->
              super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>).
              _M_impl.super__Vector_impl_data._M_finish -
       (long)(threads->
             super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>).
             _M_impl.super__Vector_impl_data._M_start) / 0x28;
  this->m_ways = 0;
  uVar1 = Chrono::steadyMSecs();
  this->m_ts = uVar1;
  return;
}

Assistant:

inline void start(const std::vector<CpuLaunchData> &threads, size_t memory)
    {
        m_hugePages = 0;
        m_memory    = memory;
        m_pages     = 0;
        m_started   = 0;
        m_errors    = 0;
        m_threads   = threads.size();
        m_ways      = 0;
        m_ts        = Chrono::steadyMSecs();
    }